

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SS.h
# Opt level: O0

int __thiscall SS<4U>::Query(SS<4U> *this,Data<4U> *item)

{
  count_type cVar1;
  
  cVar1 = StreamSummary<4U>::Query((StreamSummary<4U> *)this,item);
  return cVar1;
}

Assistant:

int Query(const Data<DATA_LEN>& item) { return summary->Query(item); }